

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O0

void mxx::
     distribute<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> out,comm *comm)

{
  bool bVar1;
  int iVar2;
  uint comm_size;
  uint comm_rank;
  int rank;
  unsigned_long uVar3;
  size_t sVar4;
  iterator __first;
  iterator __last;
  long lVar5;
  reference msgs;
  reference out_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_178;
  unsigned_long *local_170;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_168;
  int *local_160;
  comm *local_158;
  int *local_150;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_148;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_140;
  unsigned_long *local_138;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_130;
  undefined1 local_128 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  undefined1 local_d8 [8];
  vector<long,_std::allocator<long>_> surpluses;
  signed_size_t surplus;
  blk_dist part;
  size_t total_size;
  unsigned_long local_50;
  size_t local_size;
  comm *local_40;
  int *local_38;
  int *local_30;
  comm *local_28;
  comm *comm_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> out_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> end_local;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> begin_local;
  
  local_28 = comm;
  comm_local = (comm *)out._M_current;
  out_local._M_current = end._M_current;
  end_local = begin;
  iVar2 = mxx::comm::size(comm);
  if (iVar2 == 1) {
    local_30 = end_local._M_current;
    local_38 = out_local._M_current;
    local_40 = comm_local;
    std::
    copy<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (end_local,
               (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
               out_local._M_current,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)comm_local);
  }
  else {
    local_50 = std::
               distance<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                         (end_local,
                          (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                          out_local._M_current);
    uVar3 = allreduce<unsigned_long>(&local_50,local_28);
    bVar1 = any_of(local_50 == uVar3,local_28);
    if (bVar1) {
      part.div1mod = (size_t)comm_local;
      impl::
      distribute_scatter<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                (end_local,
                 (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                 out_local._M_current,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)comm_local,uVar3
                 ,local_28);
    }
    else {
      comm_size = mxx::comm::size(local_28);
      comm_rank = mxx::comm::rank(local_28);
      blk_dist_buf::blk_dist_buf((blk_dist_buf *)&surplus,uVar3,comm_size,comm_rank);
      uVar3 = local_50;
      sVar4 = blk_dist_buf::local_size((blk_dist_buf *)&surplus);
      surpluses.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)(uVar3 - sVar4);
      allgather<long>((vector<long,_std::allocator<long>_> *)local_d8,
                      (long *)&surpluses.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,local_28);
      __first = std::vector<long,_std::allocator<long>_>::begin
                          ((vector<long,_std::allocator<long>_> *)local_d8);
      __last = std::vector<long,_std::allocator<long>_>::end
                         ((vector<long,_std::allocator<long>_> *)local_d8);
      lVar5 = std::
              accumulate<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long>
                        ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                         __first._M_current,
                         (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                         __last._M_current,0);
      if (lVar5 != 0) {
        assert_fail("std::accumulate(surpluses.begin(), surpluses.end(), static_cast<impl::signed_size_t>(0)) == 0"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/distribution.hpp"
                    ,0xe9,"distribute");
      }
      iVar2 = mxx::comm::size(local_28);
      rank = mxx::comm::rank(local_28);
      impl::surplus_send_pairing
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<long,_std::allocator<long>_> *)local_d8,iVar2,rank,false);
      all2all<unsigned_long>
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,local_28);
      if ((long)surpluses.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage < 1) {
        local_168._M_current =
             (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &recv_counts.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
        local_170 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                               &recv_counts.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage);
        uVar3 = std::
                accumulate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                          (local_168,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            )local_170,0);
        if (uVar3 != 0) {
          assert_fail("std::accumulate(send_counts.begin(), send_counts.end(), static_cast<size_t>(0)) == 0"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/distribution.hpp"
                      ,0xf5,"distribute");
        }
        local_178 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator+((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              &comm_local,local_50);
        out_00 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_178);
        all2allv<int>((int *)0x0,
                      (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      &recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,out_00,
                      (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128,local_28);
        std::
        copy<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                  (end_local,
                   (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
                   out_local._M_current,
                   (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)comm_local);
      }
      else {
        local_130._M_current =
             (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128);
        local_138 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128);
        uVar3 = std::
                accumulate<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                          (local_130,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            )local_138,0);
        if (uVar3 != 0) {
          assert_fail("std::accumulate(recv_counts.begin(), recv_counts.end(), static_cast<size_t>(0)) == 0"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/patflick[P]mxx/include/mxx/distribution.hpp"
                      ,0xf0,"distribute");
        }
        local_140 = __gnu_cxx::
                    __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator+(&end_local,
                              local_50 -
                              (long)surpluses.super__Vector_base<long,_std::allocator<long>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        msgs = __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_140);
        all2allv<int>(msgs,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           &recv_counts.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,(int *)0x0,
                      (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128,local_28);
        local_148._M_current = end_local._M_current;
        local_150 = (int *)__gnu_cxx::
                           __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                           operator+(&end_local,
                                     local_50 -
                                     (long)surpluses.super__Vector_base<long,_std::allocator<long>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_158 = comm_local;
        local_160 = (int *)std::
                           copy<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                                     (local_148,
                                      (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                       )local_150,
                                      (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                       )comm_local);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_128);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<long,_std::allocator<long>_>::~vector
                ((vector<long,_std::allocator<long>_> *)local_d8);
      blk_dist_buf::~blk_dist_buf((blk_dist_buf *)&surplus);
    }
  }
  return;
}

Assistant:

void distribute(_InIterator begin, _InIterator end, _OutIterator out, const mxx::comm& comm) {
    // if single process, copy input to output
    if (comm.size() == 1) {
        std::copy(begin, end, out);
        return;
    }

    // get sizes
    size_t local_size = std::distance(begin, end);
    size_t total_size = mxx::allreduce(local_size, comm);
    typedef typename std::iterator_traits<_InIterator>::value_type T;

    if (mxx::any_of(local_size == total_size, comm)) {
        // use scatterv instead of all2all based communication
        impl::distribute_scatter(begin, end, out, total_size, comm);
    } else {
        // use surplus send-pairing to minimize total communication volume
        // TODO: use all2all or send/recv depending on the maximum number of
        //       paired processes

        // get surplus
        blk_dist part(total_size, comm.size(), comm.rank());
        impl::signed_size_t surplus = (impl::signed_size_t)local_size - (impl::signed_size_t)part.local_size();

        // allgather surpluses
        // TODO figure out how to do surplus send pairing without requiring allgather
        std::vector<impl::signed_size_t> surpluses = mxx::allgather(surplus, comm);
        MXX_ASSERT(std::accumulate(surpluses.begin(), surpluses.end(), static_cast<impl::signed_size_t>(0)) == 0);

        // get send counts
        std::vector<size_t> send_counts = impl::surplus_send_pairing(surpluses, comm.size(), comm.rank(), false);
        std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);

        if (surplus > 0) {
            MXX_ASSERT(std::accumulate(recv_counts.begin(), recv_counts.end(), static_cast<size_t>(0)) == 0);
            // TODO: use iterators not pointers
            mxx::all2allv(&(*(begin+((impl::signed_size_t)local_size-surplus))), send_counts, (T*)nullptr, recv_counts, comm);
            std::copy(begin, begin+(local_size-surplus), out);
        } else {
            MXX_ASSERT(std::accumulate(send_counts.begin(), send_counts.end(), static_cast<size_t>(0)) == 0);
            mxx::all2allv((const T*)nullptr, send_counts, &(*(out+local_size)), recv_counts, comm);
            std::copy(begin, end, out);
        }
    }
}